

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::BuildSystemRule::BuildSystemRule
          (BuildSystemRule *this,KeyType *key,CommandSignature *signature,
          function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *action,
          function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          *valid,function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>
                 *update)

{
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *update_local;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *valid_local;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *action_local;
  CommandSignature *signature_local;
  KeyType *key_local;
  BuildSystemRule *this_local;
  
  llbuild::core::Rule::Rule(&this->super_Rule,key,signature);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__BuildSystemRule_003781f0;
  std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::function(&this->action,action)
  ;
  std::
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::function(&this->resultValid,valid);
  std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
            (&this->update,update);
  return;
}

Assistant:

BuildSystemRule(
    const KeyType& key,
    const basic::CommandSignature& signature,
    std::function<Task*(BuildEngine&)> action,
    std::function<bool(BuildEngine&, const Rule&, const ValueType&)> valid = nullptr,
    std::function<void(BuildEngine&, StatusKind)> update = nullptr)
  : Rule(key, signature), action(action), resultValid(valid), update(update)
  { }